

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

string * __thiscall
perfetto::ipc::BufferedFrameDeserializer::Serialize_abi_cxx11_
          (string *__return_storage_ptr__,BufferedFrameDeserializer *this,Frame *frame)

{
  long lVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> payload;
  void *local_38;
  long local_30;
  long local_28;
  
  (**(code **)((this->buf_).p_ + 0x18))(&local_38);
  lVar1 = local_30 - (long)local_38;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)lVar1 + '\x04');
  *(int *)(__return_storage_ptr__->_M_dataplus)._M_p = (int)lVar1;
  memcpy((__return_storage_ptr__->_M_dataplus)._M_p + 4,local_38,local_30 - (long)local_38);
  if (local_38 != (void *)0x0) {
    operator_delete(local_38,local_28 - (long)local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BufferedFrameDeserializer::Serialize(const Frame& frame) {
  std::vector<uint8_t> payload = frame.SerializeAsArray();
  const uint32_t payload_size = static_cast<uint32_t>(payload.size());
  std::string buf;
  buf.resize(kHeaderSize + payload_size);
  memcpy(&buf[0], base::AssumeLittleEndian(&payload_size), kHeaderSize);
  memcpy(&buf[kHeaderSize], payload.data(), payload.size());
  return buf;
}